

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3FkCheck(Parse *pParse,Table *pTab,int regOld,int regNew)

{
  u8 uVar1;
  int iVar2;
  sqlite3 *db;
  Index *pIVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  Table *pTVar7;
  Vdbe *p;
  FKey *pFVar8;
  SrcList *pSrc;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  Schema **ppSVar9;
  ulong uVar10;
  uint uVar11;
  sColMap *psVar12;
  long lVar13;
  char *zDbase;
  int *aiCol;
  bool bVar14;
  ulong local_78;
  int *aiFree;
  Index *pIdx;
  Table *local_58;
  undefined8 local_50;
  int local_48;
  int iCol;
  char *local_40;
  undefined8 local_38;
  
  local_50 = CONCAT44(in_register_00000014,regOld);
  local_38 = CONCAT44(in_register_0000000c,regNew);
  db = pParse->db;
  if ((db->flags & 0x40000) != 0) {
    if (pTab->pSchema == (Schema *)0x0) {
      local_78 = 0xfff0bdc0;
    }
    else {
      uVar11 = db->nDb;
      if ((int)uVar11 < 1) {
        local_78 = 0;
      }
      else {
        ppSVar9 = &db->aDb->pSchema;
        uVar10 = 0;
        do {
          local_78 = uVar10;
          if (*ppSVar9 == pTab->pSchema) break;
          uVar10 = uVar10 + 1;
          ppSVar9 = ppSVar9 + 4;
          local_78 = (ulong)uVar11;
        } while (uVar11 != uVar10);
      }
    }
    uVar1 = pParse->disableTriggers;
    pFVar8 = pTab->pFKey;
    local_58 = pTab;
    if (pFVar8 != (FKey *)0x0) {
      zDbase = db->aDb[(int)local_78].zName;
      local_48 = regOld + 1;
      local_40 = zDbase;
      do {
        pIdx = (Index *)0x0;
        aiFree = (int *)0x0;
        if (pParse->disableTriggers == '\0') {
          pTVar7 = sqlite3LocateTable(pParse,0,pFVar8->zTo,zDbase);
        }
        else {
          pTVar7 = sqlite3FindTable(db,pFVar8->zTo,zDbase);
        }
        if ((pTVar7 == (Table *)0x0) ||
           (iVar6 = sqlite3FkLocateIndex(pParse,pTVar7,pFVar8,&pIdx,&aiFree), pIVar3 = pIdx,
           iVar6 != 0)) {
          if (uVar1 == '\0') {
            bVar5 = 1;
          }
          else {
            bVar14 = db->mallocFailed == '\0';
            if (bVar14 && pTVar7 == (Table *)0x0) {
              p = sqlite3GetVdbe(pParse);
              iVar4 = local_48;
              iVar6 = pFVar8->nCol;
              if (0 < iVar6) {
                iVar2 = p->nOp;
                psVar12 = pFVar8->aCol;
                lVar13 = 0;
                do {
                  sqlite3VdbeAddOp3(p,0x49,psVar12->iFrom + iVar4,iVar2 + iVar6 + 1,0);
                  lVar13 = lVar13 + 1;
                  psVar12 = psVar12 + 1;
                } while (lVar13 < pFVar8->nCol);
              }
              sqlite3VdbeAddOp3(p,0x75,(uint)pFVar8->isDeferred,-1,0);
              goto LAB_0016e138;
            }
            bVar5 = bVar14 * '\x03' + 1;
          }
        }
        else {
          aiCol = aiFree;
          if (aiFree == (int *)0x0) {
            iCol = pFVar8->aCol[0].iFrom;
            aiCol = &iCol;
          }
          if (pFVar8->nCol < 1) {
            uVar11 = 0;
          }
          else {
            lVar13 = 0;
            uVar11 = 0;
            do {
              if (aiCol[lVar13] == (int)local_58->iPKey) {
                aiCol[lVar13] = -1;
              }
              if (db->xAuth != (_func_int_void_ptr_int_char_ptr_char_ptr_char_ptr_char_ptr *)0x0) {
                if (pIVar3 == (Index *)0x0) {
                  iVar6 = (int)pTVar7->iPKey;
                }
                else {
                  iVar6 = pIVar3->aiColumn[lVar13];
                }
                iVar6 = sqlite3AuthReadCol(pParse,pTVar7->zName,pTVar7->aCol[iVar6].zName,
                                           (int)local_78);
                uVar11 = (uint)(iVar6 == 2);
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < pFVar8->nCol);
          }
          sqlite3TableLock(pParse,(int)local_78,pTVar7->tnum,'\0',pTVar7->zName);
          pParse->nTab = pParse->nTab + 1;
          if ((int)local_50 != 0) {
            fkLookupParent(pParse,(int)local_78,pTVar7,pIdx,pFVar8,aiCol,(int)local_50,-1,uVar11);
          }
          if ((int)local_38 != 0) {
            fkLookupParent(pParse,(int)local_78,pTVar7,pIdx,pFVar8,aiCol,(int)local_38,1,uVar11);
          }
          sqlite3DbFree(db,aiFree);
LAB_0016e138:
          bVar5 = 0;
          zDbase = local_40;
        }
        if ((bVar5 & 3) != 0) {
          return;
        }
        pFVar8 = pFVar8->pNextFrom;
      } while (pFVar8 != (FKey *)0x0);
    }
    pFVar8 = sqlite3FkReferences(local_58);
    if (pFVar8 != (FKey *)0x0) {
      do {
        pIdx = (Index *)0x0;
        aiFree = (int *)0x0;
        if (((pFVar8->isDeferred == '\0') && (pParse->pToplevel == (Parse *)0x0)) &&
           (pParse->isMultiWrite == '\0')) {
          iVar6 = 0xd;
        }
        else {
          iVar6 = sqlite3FkLocateIndex(pParse,local_58,pFVar8,&pIdx,&aiFree);
          if (iVar6 == 0) {
            pSrc = sqlite3SrcListAppend(db,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
            if (pSrc != (SrcList *)0x0) {
              pTVar7 = pFVar8->pFrom;
              pSrc->a[0].pTab = pTVar7;
              pSrc->a[0].zName = pTVar7->zName;
              pTVar7->nRef = pTVar7->nRef + 1;
              iVar6 = pParse->nTab;
              pParse->nTab = iVar6 + 1;
              pSrc->a[0].iCursor = iVar6;
              if ((int)local_38 != 0) {
                fkScanChildren(pParse,pSrc,local_58,pIdx,pFVar8,aiFree,(int)local_38,-1);
              }
              if ((int)local_50 != 0) {
                fkScanChildren(pParse,pSrc,local_58,pIdx,pFVar8,aiFree,(int)local_50,1);
              }
              pSrc->a[0].zName = (char *)0x0;
              sqlite3SrcListDelete(db,pSrc);
            }
            sqlite3DbFree(db,aiFree);
            iVar6 = 0;
          }
          else if (uVar1 == '\0') {
            iVar6 = 1;
          }
          else {
            iVar6 = 1;
            if (db->mallocFailed == '\0') {
              iVar6 = 0xd;
            }
          }
        }
      } while (((iVar6 == 0xd) || (iVar6 == 0)) && (pFVar8 = pFVar8->pNextTo, pFVar8 != (FKey *)0x0)
              );
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkCheck(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Row is being deleted from this table */ 
  int regOld,                     /* Previous row data is stored here */
  int regNew                      /* New row data is stored here */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  FKey *pFKey;                    /* Used to iterate through FKs */
  int iDb;                        /* Index of database containing pTab */
  const char *zDb;                /* Name of database containing pTab */
  int isIgnoreErrors = pParse->disableTriggers;

  /* Exactly one of regOld and regNew should be non-zero. */
  assert( (regOld==0)!=(regNew==0) );

  /* If foreign-keys are disabled, this function is a no-op. */
  if( (db->flags&SQLITE_ForeignKeys)==0 ) return;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  zDb = db->aDb[iDb].zName;

  /* Loop through all the foreign key constraints for which pTab is the
  ** child table (the table that the foreign key definition is part of).  */
  for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
    Table *pTo;                   /* Parent table of foreign key pFKey */
    Index *pIdx = 0;              /* Index on key columns in pTo */
    int *aiFree = 0;
    int *aiCol;
    int iCol;
    int i;
    int isIgnore = 0;

    /* Find the parent table of this foreign key. Also find a unique index 
    ** on the parent key columns in the parent table. If either of these 
    ** schema items cannot be located, set an error in pParse and return 
    ** early.  */
    if( pParse->disableTriggers ){
      pTo = sqlite3FindTable(db, pFKey->zTo, zDb);
    }else{
      pTo = sqlite3LocateTable(pParse, 0, pFKey->zTo, zDb);
    }
    if( !pTo || sqlite3FkLocateIndex(pParse, pTo, pFKey, &pIdx, &aiFree) ){
      assert( isIgnoreErrors==0 || (regOld!=0 && regNew==0) );
      if( !isIgnoreErrors || db->mallocFailed ) return;
      if( pTo==0 ){
        /* If isIgnoreErrors is true, then a table is being dropped. In this
        ** case SQLite runs a "DELETE FROM xxx" on the table being dropped
        ** before actually dropping it in order to check FK constraints.
        ** If the parent table of an FK constraint on the current table is
        ** missing, behave as if it is empty. i.e. decrement the relevant
        ** FK counter for each row of the current table with non-NULL keys.
        */
        Vdbe *v = sqlite3GetVdbe(pParse);
        int iJump = sqlite3VdbeCurrentAddr(v) + pFKey->nCol + 1;
        for(i=0; i<pFKey->nCol; i++){
          int iReg = pFKey->aCol[i].iFrom + regOld + 1;
          sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iJump);
        }
        sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, -1);
      }
      continue;
    }
    assert( pFKey->nCol==1 || (aiFree && pIdx) );

    if( aiFree ){
      aiCol = aiFree;
    }else{
      iCol = pFKey->aCol[0].iFrom;
      aiCol = &iCol;
    }
    for(i=0; i<pFKey->nCol; i++){
      if( aiCol[i]==pTab->iPKey ){
        aiCol[i] = -1;
      }
#ifndef SQLITE_OMIT_AUTHORIZATION
      /* Request permission to read the parent key columns. If the 
      ** authorization callback returns SQLITE_IGNORE, behave as if any
      ** values read from the parent table are NULL. */
      if( db->xAuth ){
        int rcauth;
        char *zCol = pTo->aCol[pIdx ? pIdx->aiColumn[i] : pTo->iPKey].zName;
        rcauth = sqlite3AuthReadCol(pParse, pTo->zName, zCol, iDb);
        isIgnore = (rcauth==SQLITE_IGNORE);
      }
#endif
    }

    /* Take a shared-cache advisory read-lock on the parent table. Allocate 
    ** a cursor to use to search the unique index on the parent key columns 
    ** in the parent table.  */
    sqlite3TableLock(pParse, iDb, pTo->tnum, 0, pTo->zName);
    pParse->nTab++;

    if( regOld!=0 ){
      /* A row is being removed from the child table. Search for the parent.
      ** If the parent does not exist, removing the child row resolves an 
      ** outstanding foreign key constraint violation. */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regOld, -1,isIgnore);
    }
    if( regNew!=0 ){
      /* A row is being added to the child table. If a parent row cannot
      ** be found, adding the child row has violated the FK constraint. */ 
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regNew, +1,isIgnore);
    }

    sqlite3DbFree(db, aiFree);
  }

  /* Loop through all the foreign key constraints that refer to this table */
  for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
    Index *pIdx = 0;              /* Foreign key index for pFKey */
    SrcList *pSrc;
    int *aiCol = 0;

    if( !pFKey->isDeferred && !pParse->pToplevel && !pParse->isMultiWrite ){
      assert( regOld==0 && regNew!=0 );
      /* Inserting a single row into a parent table cannot cause an immediate
      ** foreign key violation. So do nothing in this case.  */
      continue;
    }

    if( sqlite3FkLocateIndex(pParse, pTab, pFKey, &pIdx, &aiCol) ){
      if( !isIgnoreErrors || db->mallocFailed ) return;
      continue;
    }
    assert( aiCol || pFKey->nCol==1 );

    /* Create a SrcList structure containing a single table (the table 
    ** the foreign key that refers to this table is attached to). This
    ** is required for the sqlite3WhereXXX() interface.  */
    pSrc = sqlite3SrcListAppend(db, 0, 0, 0);
    if( pSrc ){
      struct SrcList_item *pItem = pSrc->a;
      pItem->pTab = pFKey->pFrom;
      pItem->zName = pFKey->pFrom->zName;
      pItem->pTab->nRef++;
      pItem->iCursor = pParse->nTab++;
  
      if( regNew!=0 ){
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regNew, -1);
      }
      if( regOld!=0 ){
        /* If there is a RESTRICT action configured for the current operation
        ** on the parent table of this FK, then throw an exception 
        ** immediately if the FK constraint is violated, even if this is a
        ** deferred trigger. That's what RESTRICT means. To defer checking
        ** the constraint, the FK should specify NO ACTION (represented
        ** using OE_None). NO ACTION is the default.  */
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regOld, 1);
      }
      pItem->zName = 0;
      sqlite3SrcListDelete(db, pSrc);
    }
    sqlite3DbFree(db, aiCol);
  }
}